

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ArenaStringPtr::Set
          (ArenaStringPtr *this,string *default_value,string *value,Arena *arena)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  string *this_00;
  ArenaImpl *in_RCX;
  string *in_RDX;
  TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  string *s;
  string *current;
  size_t n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  ArenaStringPtr *in_stack_ffffffffffffff10;
  type_info *in_stack_ffffffffffffff18;
  _func_void_void_ptr *in_stack_ffffffffffffff30;
  ArenaImpl *in_stack_ffffffffffffff40;
  ArenaStringPtr *in_stack_ffffffffffffffc0;
  
  bVar1 = IsDefault(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  if (bVar1) {
    if (in_RCX == (ArenaImpl *)0x0) {
      pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               operator_new(0x20);
      std::__cxx11::string::string((string *)pbVar2,in_RDX);
      TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      Set(in_RDI,pbVar2);
    }
    else {
      if (in_RCX == (ArenaImpl *)0x0) {
        pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 operator_new(0x20);
        std::__cxx11::string::string((string *)pbVar2,in_RDX);
      }
      else {
        AlignUpTo8(0x20);
        ArenaImpl::RecordAlloc(in_RCX,in_stack_ffffffffffffff18,(size_t)in_stack_ffffffffffffff10);
        pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ArenaImpl::AllocateAlignedAndAddCleanup
                           (in_stack_ffffffffffffff40,(size_t)in_RDI,in_stack_ffffffffffffff30);
        std::__cxx11::string::string((string *)pbVar2,in_RDX);
      }
      TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      Set(in_RDI,pbVar2);
    }
  }
  else {
    bVar1 = IsDonatedString((ArenaStringPtr *)in_RDI);
    if (bVar1) {
      pbVar2 = TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::Get((TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x40a2cd);
      std::__cxx11::string::string((string *)pbVar2,in_RDX);
      Arena::OwnDestructor<std::__cxx11::string>((Arena *)pbVar2,in_stack_ffffffffffffff08);
      TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      Set(in_RDI,pbVar2);
    }
    else {
      this_00 = UnsafeMutablePointer_abi_cxx11_(in_stack_ffffffffffffffc0);
      std::__cxx11::string::operator=((string *)this_00,in_RDX);
    }
  }
  return;
}

Assistant:

void ArenaStringPtr::Set(const std::string* default_value, std::string&& value,
                         ::google::protobuf::Arena* arena) {
  if (IsDefault(default_value)) {
    if (arena == nullptr) {
      tagged_ptr_.Set(new std::string(std::move(value)));
    } else {
      tagged_ptr_.Set(Arena::Create<std::string>(arena, std::move(value)));
    }
  } else if (IsDonatedString()) {
    std::string* current = tagged_ptr_.Get();
    auto* s = new (current) std::string(std::move(value));
    arena->OwnDestructor(s);
    tagged_ptr_.Set(s);
  } else /* !IsDonatedString() */ {
    *UnsafeMutablePointer() = std::move(value);
  }
}